

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-oid.c
# Opt level: O0

void test_oid_install(TestSuite *suite)

{
  TestSuite *suite_local;
  
  TestSuite_Add(suite,"/bson/oid/init",test_bson_oid_init);
  TestSuite_Add(suite,"/bson/oid/init_from_string",test_bson_oid_init_from_string);
  TestSuite_Add(suite,"/bson/oid/init_sequence",test_bson_oid_init_sequence);
  TestSuite_Add(suite,"/bson/oid/init_sequence_thread_safe",test_bson_oid_init_sequence_thread_safe)
  ;
  TestSuite_Add(suite,"/bson/oid/init_sequence_with_tid",test_bson_oid_init_sequence_with_tid);
  TestSuite_Add(suite,"/bson/oid/init_with_threads",test_bson_oid_init_with_threads);
  TestSuite_Add(suite,"/bson/oid/hash",test_bson_oid_hash);
  TestSuite_Add(suite,"/bson/oid/compare",test_bson_oid_compare);
  TestSuite_Add(suite,"/bson/oid/copy",test_bson_oid_copy);
  TestSuite_Add(suite,"/bson/oid/get_time_t",test_bson_oid_get_time_t);
  return;
}

Assistant:

void
test_oid_install (TestSuite *suite)
{
   TestSuite_Add (suite, "/bson/oid/init", test_bson_oid_init);
   TestSuite_Add (
      suite, "/bson/oid/init_from_string", test_bson_oid_init_from_string);
   TestSuite_Add (
      suite, "/bson/oid/init_sequence", test_bson_oid_init_sequence);
   TestSuite_Add (suite,
                  "/bson/oid/init_sequence_thread_safe",
                  test_bson_oid_init_sequence_thread_safe);
#ifdef BSON_HAVE_SYSCALL_TID
   TestSuite_Add (suite,
                  "/bson/oid/init_sequence_with_tid",
                  test_bson_oid_init_sequence_with_tid);
#endif
   TestSuite_Add (
      suite, "/bson/oid/init_with_threads", test_bson_oid_init_with_threads);
   TestSuite_Add (suite, "/bson/oid/hash", test_bson_oid_hash);
   TestSuite_Add (suite, "/bson/oid/compare", test_bson_oid_compare);
   TestSuite_Add (suite, "/bson/oid/copy", test_bson_oid_copy);
   TestSuite_Add (suite, "/bson/oid/get_time_t", test_bson_oid_get_time_t);
}